

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_conserve.cpp
# Opt level: O3

void Omega_h::transfer_conserve_motion
               (Mesh *old_mesh,TransferOpts *opts,Mesh *new_mesh,LOs *keys2verts,Graph *keys2elems,
               LOs *same_ents2old_ents,LOs *same_ents2new_ents)

{
  int *piVar1;
  undefined1 auVar2 [12];
  Alloc *pAVar3;
  undefined8 uVar4;
  Alloc *this;
  Alloc *this_00;
  bool bVar5;
  long lVar6;
  undefined1 *puVar7;
  undefined1 *puVar8;
  Graph bdry_keys2doms;
  LOs prods2new_ents;
  LOs keys2prods;
  Cavs init_cavs;
  CavsByBdryStatus cavs;
  uint in_stack_fffffffffffffd78;
  Read<int> local_270;
  Read<int> local_260;
  undefined1 local_250 [24];
  pointer local_238;
  Alloc *local_230;
  pointer local_228;
  Read<int> local_220;
  Read<int> local_210;
  LOs local_200;
  LOs local_1f0;
  Alloc *local_1e0;
  pointer local_1d8;
  Alloc *local_1d0;
  pointer local_1c8;
  Cavs local_1c0;
  Mesh *local_180;
  LOs local_178;
  LOs local_168;
  LOs local_158;
  Cavs local_148;
  
  bVar5 = should_conserve_any(old_mesh,opts);
  if (bVar5) {
    local_1d0 = (keys2elems->a2ab).write_.shared_alloc_.alloc;
    if (((ulong)local_1d0 & 7) == 0 && local_1d0 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_1d0 = (Alloc *)(local_1d0->size * 8 + 1);
      }
      else {
        local_1d0->use_count = local_1d0->use_count + 1;
      }
    }
    local_200.write_.shared_alloc_.direct_ptr = (keys2elems->a2ab).write_.shared_alloc_.direct_ptr;
    local_1e0 = (keys2elems->ab2b).write_.shared_alloc_.alloc;
    if (((ulong)local_1e0 & 7) == 0 && local_1e0 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_1e0 = (Alloc *)(local_1e0->size * 8 + 1);
      }
      else {
        local_1e0->use_count = local_1e0->use_count + 1;
      }
    }
    local_1d8 = (pointer)(keys2elems->ab2b).write_.shared_alloc_.direct_ptr;
    local_1f0.write_.shared_alloc_.alloc = (keys2verts->write_).shared_alloc_.alloc;
    if (((ulong)local_1f0.write_.shared_alloc_.alloc & 7) == 0 &&
        local_1f0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_1f0.write_.shared_alloc_.alloc =
             (Alloc *)((local_1f0.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_1f0.write_.shared_alloc_.alloc)->use_count =
             (local_1f0.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    pAVar3 = local_1f0.write_.shared_alloc_.alloc;
    local_1f0.write_.shared_alloc_.direct_ptr = (keys2verts->write_).shared_alloc_.direct_ptr;
    local_200.write_.shared_alloc_.alloc = local_1d0;
    if (((ulong)local_1d0 & 7) == 0 && local_1d0 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_200.write_.shared_alloc_.alloc = (Alloc *)(local_1d0->size * 8 + 1);
      }
      else {
        local_1d0->use_count = local_1d0->use_count + 1;
      }
    }
    this = local_200.write_.shared_alloc_.alloc;
    local_158.write_.shared_alloc_.alloc = local_1e0;
    if (((ulong)local_1e0 & 7) == 0 && local_1e0 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_158.write_.shared_alloc_.alloc = (Alloc *)(local_1e0->size * 8 + 1);
      }
      else {
        local_1e0->use_count = local_1e0->use_count + 1;
      }
    }
    this_00 = local_158.write_.shared_alloc_.alloc;
    local_1c8 = (pointer)local_200.write_.shared_alloc_.direct_ptr;
    local_180 = (Mesh *)opts;
    local_158.write_.shared_alloc_.direct_ptr = local_1d8;
    form_initial_cavs(&local_1c0,old_mesh,(Mesh *)(ulong)(uint)new_mesh->dim_,0,&local_1f0,
                      &local_200,&local_158);
    if (((ulong)this_00 & 7) == 0 && this_00 != (Alloc *)0x0) {
      piVar1 = &this_00->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(this_00);
        operator_delete(this_00,0x48);
      }
    }
    if (((ulong)this & 7) == 0 && this != (Alloc *)0x0) {
      piVar1 = &this->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(this);
        operator_delete(this,0x48);
      }
    }
    if (((ulong)pAVar3 & 7) == 0 && pAVar3 != (Alloc *)0x0) {
      piVar1 = &pAVar3->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar3);
        operator_delete(pAVar3,0x48);
      }
    }
    local_260.write_.shared_alloc_.alloc = local_1c0.keys2old_elems.a2ab.write_.shared_alloc_.alloc;
    if (((ulong)local_1c0.keys2old_elems.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
        local_1c0.keys2old_elems.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_260.write_.shared_alloc_.alloc =
             (Alloc *)((local_1c0.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_1c0.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->use_count =
             (local_1c0.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_260.write_.shared_alloc_.direct_ptr =
         local_1c0.keys2old_elems.a2ab.write_.shared_alloc_.direct_ptr;
    local_210.write_.shared_alloc_.alloc = local_1c0.keys2new_elems.a2ab.write_.shared_alloc_.alloc;
    if (((ulong)local_1c0.keys2new_elems.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
        local_1c0.keys2new_elems.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_210.write_.shared_alloc_.alloc =
             (Alloc *)((local_1c0.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_1c0.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->use_count =
             (local_1c0.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_210.write_.shared_alloc_.direct_ptr =
         local_1c0.keys2new_elems.a2ab.write_.shared_alloc_.direct_ptr;
    bVar5 = operator==(&local_260,&local_210);
    pAVar3 = local_210.write_.shared_alloc_.alloc;
    if (!bVar5) {
      fail("assertion %s failed at %s +%d\n",
           "init_cavs.keys2old_elems.a2ab == init_cavs.keys2new_elems.a2ab",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_conserve.cpp"
           ,0x21b);
    }
    if (((ulong)local_210.write_.shared_alloc_.alloc & 7) == 0 &&
        local_210.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_210.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_210.write_.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
      }
    }
    pAVar3 = local_260.write_.shared_alloc_.alloc;
    if (((ulong)local_260.write_.shared_alloc_.alloc & 7) == 0 &&
        local_260.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_260.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_260.write_.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
      }
    }
    local_270.write_.shared_alloc_.alloc = local_1c0.keys2old_elems.ab2b.write_.shared_alloc_.alloc;
    if (((ulong)local_1c0.keys2old_elems.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
        local_1c0.keys2old_elems.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_270.write_.shared_alloc_.alloc =
             (Alloc *)((local_1c0.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_1c0.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->use_count =
             (local_1c0.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_270.write_.shared_alloc_.direct_ptr =
         local_1c0.keys2old_elems.ab2b.write_.shared_alloc_.direct_ptr;
    local_220.write_.shared_alloc_.alloc = local_1c0.keys2new_elems.ab2b.write_.shared_alloc_.alloc;
    if (((ulong)local_1c0.keys2new_elems.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
        local_1c0.keys2new_elems.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_220.write_.shared_alloc_.alloc =
             (Alloc *)((local_1c0.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_1c0.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->use_count =
             (local_1c0.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_220.write_.shared_alloc_.direct_ptr =
         local_1c0.keys2new_elems.ab2b.write_.shared_alloc_.direct_ptr;
    bVar5 = operator==(&local_270,&local_220);
    pAVar3 = local_220.write_.shared_alloc_.alloc;
    if (!bVar5) {
      fail("assertion %s failed at %s +%d\n",
           "init_cavs.keys2old_elems.ab2b == init_cavs.keys2new_elems.ab2b",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_conserve.cpp"
           ,0x21c);
    }
    if (((ulong)local_220.write_.shared_alloc_.alloc & 7) == 0 &&
        local_220.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_220.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_220.write_.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
      }
    }
    pAVar3 = local_270.write_.shared_alloc_.alloc;
    if (((ulong)local_270.write_.shared_alloc_.alloc & 7) == 0 &&
        local_270.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_270.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_270.write_.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
      }
    }
    local_250._16_8_ = (keys2elems->a2ab).write_.shared_alloc_.alloc;
    if ((local_250._16_8_ & 7) == 0 && (Alloc *)local_250._16_8_ != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_250._16_8_ = ((Alloc *)local_250._16_8_)->size * 8 + 1;
      }
      else {
        ((Alloc *)local_250._16_8_)->use_count = ((Alloc *)local_250._16_8_)->use_count + 1;
      }
    }
    local_238 = (pointer)(keys2elems->a2ab).write_.shared_alloc_.direct_ptr;
    local_230 = (keys2elems->ab2b).write_.shared_alloc_.alloc;
    if (((ulong)local_230 & 7) == 0 && local_230 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_230 = (Alloc *)(local_230->size * 8 + 1);
      }
      else {
        local_230->use_count = local_230->use_count + 1;
      }
    }
    local_228 = (pointer)(keys2elems->ab2b).write_.shared_alloc_.direct_ptr;
    local_148.keys2old_elems.a2ab.write_.shared_alloc_.alloc =
         local_1c0.keys2old_elems.a2ab.write_.shared_alloc_.alloc;
    if (((ulong)local_1c0.keys2old_elems.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
        local_1c0.keys2old_elems.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_148.keys2old_elems.a2ab.write_.shared_alloc_.alloc =
             (Alloc *)((local_1c0.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_1c0.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->use_count =
             (local_1c0.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_148.keys2old_elems.a2ab.write_.shared_alloc_.direct_ptr =
         local_1c0.keys2old_elems.a2ab.write_.shared_alloc_.direct_ptr;
    local_148.keys2old_elems.ab2b.write_.shared_alloc_.alloc =
         local_1c0.keys2old_elems.ab2b.write_.shared_alloc_.alloc;
    if (((ulong)local_1c0.keys2old_elems.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
        local_1c0.keys2old_elems.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_148.keys2old_elems.ab2b.write_.shared_alloc_.alloc =
             (Alloc *)((local_1c0.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_1c0.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->use_count =
             (local_1c0.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_148.keys2old_elems.ab2b.write_.shared_alloc_.direct_ptr =
         local_1c0.keys2old_elems.ab2b.write_.shared_alloc_.direct_ptr;
    local_148.keys2new_elems.a2ab.write_.shared_alloc_.alloc =
         local_1c0.keys2new_elems.a2ab.write_.shared_alloc_.alloc;
    if (((ulong)local_1c0.keys2new_elems.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
        local_1c0.keys2new_elems.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_148.keys2new_elems.a2ab.write_.shared_alloc_.alloc =
             (Alloc *)((local_1c0.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_1c0.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->use_count =
             (local_1c0.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_148.keys2new_elems.a2ab.write_.shared_alloc_.direct_ptr =
         local_1c0.keys2new_elems.a2ab.write_.shared_alloc_.direct_ptr;
    local_148.keys2new_elems.ab2b.write_.shared_alloc_.alloc =
         local_1c0.keys2new_elems.ab2b.write_.shared_alloc_.alloc;
    if (((ulong)local_1c0.keys2new_elems.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
        local_1c0.keys2new_elems.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_148.keys2new_elems.ab2b.write_.shared_alloc_.alloc =
             (Alloc *)((local_1c0.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_1c0.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->use_count =
             (local_1c0.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_148.keys2new_elems.ab2b.write_.shared_alloc_.direct_ptr =
         local_1c0.keys2new_elems.ab2b.write_.shared_alloc_.direct_ptr;
    local_168.write_.shared_alloc_.alloc = (keys2verts->write_).shared_alloc_.alloc;
    if (((ulong)local_168.write_.shared_alloc_.alloc & 7) == 0 &&
        local_168.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_168.write_.shared_alloc_.alloc =
             (Alloc *)((local_168.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_168.write_.shared_alloc_.alloc)->use_count =
             (local_168.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    pAVar3 = local_168.write_.shared_alloc_.alloc;
    local_168.write_.shared_alloc_.direct_ptr = (keys2verts->write_).shared_alloc_.direct_ptr;
    separate_cavities((CavsByBdryStatus *)&stack0xfffffffffffffef8,old_mesh,new_mesh,&local_148,0,
                      &local_168,(Graph *)(local_250 + 0x10));
    if (((ulong)pAVar3 & 7) == 0 && pAVar3 != (Alloc *)0x0) {
      piVar1 = &pAVar3->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar3);
        operator_delete(pAVar3,0x48);
      }
    }
    Cavs::~Cavs(&local_148);
    local_250._0_8_ = (same_ents2old_ents->write_).shared_alloc_.alloc;
    if ((local_250._0_8_ & 7) == 0 && (Alloc *)local_250._0_8_ != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_250._0_8_ = ((Alloc *)local_250._0_8_)->size * 8 + 1;
      }
      else {
        ((Alloc *)local_250._0_8_)->use_count = ((Alloc *)local_250._0_8_)->use_count + 1;
      }
    }
    uVar4 = local_250._0_8_;
    local_250._8_8_ = (same_ents2old_ents->write_).shared_alloc_.direct_ptr;
    local_178.write_.shared_alloc_.alloc = (same_ents2new_ents->write_).shared_alloc_.alloc;
    if (((ulong)local_178.write_.shared_alloc_.alloc & 7) == 0 &&
        local_178.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_178.write_.shared_alloc_.alloc =
             (Alloc *)((local_178.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_178.write_.shared_alloc_.alloc)->use_count =
             (local_178.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    pAVar3 = local_178.write_.shared_alloc_.alloc;
    local_178.write_.shared_alloc_.direct_ptr =
         (same_ents2new_ents->write_).shared_alloc_.direct_ptr;
    auVar2._4_8_ = 0;
    auVar2._0_4_ = in_stack_fffffffffffffd78;
    transfer_conservation_errors
              ((Omega_h *)old_mesh,local_180,(TransferOpts *)new_mesh,
               (Mesh *)&stack0xfffffffffffffef8,(CavsByBdryStatus *)local_250,&local_178,
               (LOs *)0x1000101,(OpConservation)(auVar2 << 0x40));
    if (((ulong)pAVar3 & 7) == 0 && pAVar3 != (Alloc *)0x0) {
      piVar1 = &pAVar3->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar3);
        operator_delete(pAVar3,0x48);
      }
    }
    if ((uVar4 & 7) == 0 && (Alloc *)uVar4 != (Alloc *)0x0) {
      piVar1 = (int *)(uVar4 + 0x30);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc((Alloc *)uVar4);
        operator_delete((void *)uVar4,0x48);
      }
    }
    puVar7 = &stack0xffffffffffffffd0;
    puVar8 = &stack0xfffffffffffffef8;
    do {
      lVar6 = 0xc0;
      do {
        std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>::~vector
                  ((vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_> *)(puVar8 + lVar6));
        pAVar3 = local_230;
        lVar6 = lVar6 + -0x18;
      } while (lVar6 != 0x78);
      puVar7 = puVar7 + -0x48;
      puVar8 = puVar8 + -0x48;
    } while (puVar7 != &stack0xfffffffffffffef8);
    if (((ulong)local_230 & 7) == 0 && local_230 != (Alloc *)0x0) {
      piVar1 = &local_230->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_230);
        operator_delete(pAVar3,0x48);
      }
    }
    uVar4 = local_250._16_8_;
    if ((local_250._16_8_ & 7) == 0 && (Alloc *)local_250._16_8_ != (Alloc *)0x0) {
      piVar1 = (int *)(local_250._16_8_ + 0x30);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc((Alloc *)local_250._16_8_);
        operator_delete((void *)uVar4,0x48);
      }
    }
    Cavs::~Cavs(&local_1c0);
    pAVar3 = local_1e0;
    if (((ulong)local_1e0 & 7) == 0 && local_1e0 != (Alloc *)0x0) {
      piVar1 = &local_1e0->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_1e0);
        operator_delete(pAVar3,0x48);
      }
    }
    pAVar3 = local_1d0;
    if (((ulong)local_1d0 & 7) == 0 && local_1d0 != (Alloc *)0x0) {
      piVar1 = &local_1d0->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_1d0);
        operator_delete(pAVar3,0x48);
      }
    }
  }
  return;
}

Assistant:

void transfer_conserve_motion(Mesh* old_mesh, TransferOpts const& opts,
    Mesh* new_mesh, LOs keys2verts, Graph keys2elems, LOs same_ents2old_ents,
    LOs same_ents2new_ents) {
  if (!should_conserve_any(old_mesh, opts)) return;
  auto keys2prods = keys2elems.a2ab;
  auto prods2new_ents = keys2elems.ab2b;
  auto init_cavs = form_initial_cavs(
      old_mesh, new_mesh, VERT, keys2verts, keys2prods, prods2new_ents);
  OMEGA_H_CHECK(init_cavs.keys2old_elems.a2ab == init_cavs.keys2new_elems.a2ab);
  OMEGA_H_CHECK(init_cavs.keys2old_elems.ab2b == init_cavs.keys2new_elems.ab2b);
  auto bdry_keys2doms = keys2elems;
  auto cavs = separate_cavities(
      old_mesh, new_mesh, init_cavs, VERT, keys2verts, &bdry_keys2doms);
  OpConservation op_conservation;
  op_conservation.density.this_time[NOT_BDRY] = true;
  op_conservation.density.this_time[TOUCH_BDRY] = true;
  op_conservation.density.this_time[KEY_BDRY] = false;
  op_conservation.momentum.this_time[NOT_BDRY] = false;
  op_conservation.momentum.this_time[TOUCH_BDRY] = false;
  op_conservation.momentum.this_time[KEY_BDRY] = false;
  transfer_conservation_errors(old_mesh, opts, new_mesh, cavs,
      same_ents2old_ents, same_ents2new_ents, op_conservation);
}